

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.cpp
# Opt level: O0

string * helics::fileops::getName_abi_cxx11_(value *element)

{
  bool bVar1;
  enable_if_t<detail::is_exact_toml_type<basic_string<char>,_basic_value<type_config>_>::value,_const_cxx::remove_cvref_t<basic_string<char,_char_traits<char>,_allocator<char>_>_>_&>
  this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  basic_value<toml::type_config> *in_stack_00000008;
  string *retval;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  
  __str = in_RDI;
  toml::find_or<std::__cxx11::string,toml::type_config,char[4]>
            (in_stack_00000008,(char (*) [4])unaff_retaddr,in_RDI);
  std::__cxx11::string::string
            (unaff_retaddr,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6bb1cf);
  if (bVar1) {
    this = toml::find_or<std::__cxx11::string,toml::type_config,char[5]>
                     (in_stack_00000008,(char (*) [5])unaff_retaddr,__str);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               in_stack_ffffffffffffffb8);
  }
  return in_RDI;
}

Assistant:

std::string getName(const toml::value& element)
{
    std::string retval = toml::find_or(element, "key", emptyString);
    if (retval.empty()) {
        retval = toml::find_or(element, "name", emptyString);
    }
    return retval;
}